

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

uchar __thiscall IDisk::GetNextByte(IDisk *this,int side,uint track,uint offset)

{
  uint uVar1;
  MFMTrack *pMVar2;
  uint uVar3;
  byte bVar4;
  int i;
  uint uVar5;
  
  uVar3 = offset + 1;
  pMVar2 = this->side_[side].tracks;
  uVar1 = pMVar2[track].size;
  bVar4 = 0;
  for (uVar5 = 0; uVar5 < 0x10; uVar5 = uVar5 + 2) {
    if (uVar1 <= uVar3) {
      uVar3 = uVar3 % uVar1;
    }
    bVar4 = bVar4 * '\x02' | pMVar2[track].bitfield[uVar3] & 1;
    uVar3 = uVar3 + 2;
  }
  return bVar4;
}

Assistant:

unsigned char IDisk::GetNextByte(int side, unsigned int track, unsigned int offset) const
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].size)
         offset = offset % side_[side].tracks[track].size;

      const unsigned char b = side_[side].tracks[track].bitfield[offset];
      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}